

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *ticket_ctx,uint16_t *key_exchange_id,uint16_t *csid,
              ptls_iovec_t *negotiated_protocol,uint8_t *src,uint8_t *end)

{
  uint8_t *end_00;
  uint8_t *puVar1;
  long *plVar2;
  uint8_t *puVar3;
  ptls_iovec_t pVar4;
  uint8_t *local_110;
  size_t local_108;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  size_t local_d0;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  size_t local_98;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint16_t *csid_local;
  uint16_t *key_exchange_id_local;
  ptls_iovec_t *ticket_ctx_local;
  uint32_t *ticket_age_add_local;
  ptls_iovec_t *psk_local;
  uint64_t *issued_at_local;
  
  _block_size = 2;
  if ((ulong)((long)end - (long)src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    _block_size64 = 0;
    plVar2 = (long *)src;
    do {
      src = (uint8_t *)plVar2;
      plVar2 = (long *)(src + 1);
      _block_size64 = _block_size64 << 8 | (ulong)*src;
      _block_size = _block_size - 1;
    } while (_block_size != 0);
    if ((ulong)((long)end - (long)plVar2) < _block_size64) {
      _capacity._4_4_ = 0x32;
    }
    else {
      end_00 = (uint8_t *)((long)plVar2 + _block_size64);
      if (((ulong)((long)end_00 - (long)plVar2) < 8) || (*plVar2 != 0x31303030736c7470)) {
        _capacity._4_4_ = 0x32;
      }
      else {
        src = src + 9;
        _capacity._4_4_ = ptls_decode64(issued_at,&src,end_00);
        if (_capacity._4_4_ == 0) {
          _block_size_1 = 2;
          if ((ulong)((long)end_00 - (long)src) < 2) {
            _capacity._4_4_ = 0x32;
          }
          else {
            _block_size64_1 = 0;
            do {
              puVar3 = src + 1;
              _block_size64_1 = _block_size64_1 << 8 | (ulong)*src;
              _block_size_1 = _block_size_1 - 1;
              src = puVar3;
            } while (_block_size_1 != 0);
            if ((ulong)((long)end_00 - (long)puVar3) < _block_size64_1) {
              _capacity._4_4_ = 0x32;
            }
            else {
              pVar4 = ptls_iovec_init(puVar3,(long)(puVar3 + _block_size64_1) - (long)puVar3);
              _capacity_2 = (size_t)pVar4.base;
              psk->base = (uint8_t *)_capacity_2;
              local_98 = pVar4.len;
              psk->len = local_98;
              src = puVar3 + _block_size64_1;
              _capacity._4_4_ = ptls_decode16(key_exchange_id,&src,end_00);
              if (((_capacity._4_4_ == 0) &&
                  (_capacity._4_4_ = ptls_decode16(csid,&src,end_00), _capacity._4_4_ == 0)) &&
                 (_capacity._4_4_ = ptls_decode32(ticket_age_add,&src,end_00), _capacity._4_4_ == 0)
                 ) {
                _block_size_2 = 2;
                if ((ulong)((long)end_00 - (long)src) < 2) {
                  _capacity._4_4_ = 0x32;
                }
                else {
                  _block_size64_2 = 0;
                  do {
                    puVar3 = src + 1;
                    _block_size64_2 = _block_size64_2 << 8 | (ulong)*src;
                    _block_size_2 = _block_size_2 - 1;
                    src = puVar3;
                  } while (_block_size_2 != 0);
                  if ((ulong)((long)end_00 - (long)puVar3) < _block_size64_2) {
                    _capacity._4_4_ = 0x32;
                  }
                  else {
                    puVar1 = puVar3 + _block_size64_2;
                    pVar4 = ptls_iovec_init(puVar3,(long)puVar1 - (long)puVar3);
                    _capacity_3 = (size_t)pVar4.base;
                    ticket_ctx->base = (uint8_t *)_capacity_3;
                    local_d0 = pVar4.len;
                    ticket_ctx->len = local_d0;
                    _block_size_3 = 1;
                    if (end_00 == puVar1) {
                      _capacity._4_4_ = 0x32;
                    }
                    else {
                      _block_size64_3 = 0;
                      src = puVar1;
                      do {
                        puVar3 = src + 1;
                        _block_size64_3 = _block_size64_3 << 8 | (ulong)*src;
                        _block_size_3 = _block_size_3 - 1;
                        src = puVar3;
                      } while (_block_size_3 != 0);
                      if ((ulong)((long)end_00 - (long)puVar3) < _block_size64_3) {
                        _capacity._4_4_ = 0x32;
                      }
                      else {
                        puVar1 = puVar3 + _block_size64_3;
                        pVar4 = ptls_iovec_init(puVar3,(long)puVar1 - (long)puVar3);
                        local_110 = pVar4.base;
                        negotiated_protocol->base = local_110;
                        local_108 = pVar4.len;
                        negotiated_protocol->len = local_108;
                        if (puVar1 == end_00) {
                          if (puVar1 != end) {
                            _capacity._4_4_ = 0x32;
                          }
                        }
                        else {
                          _capacity._4_4_ = 0x32;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *ticket_ctx,
                              uint16_t *key_exchange_id, uint16_t *csid, ptls_iovec_t *negotiated_protocol, const uint8_t *src,
                              const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_block(src, end, 2, {
        if (end - src < SESSION_IDENTIFIER_MAGIC_SIZE ||
            memcmp(src, SESSION_IDENTIFIER_MAGIC, SESSION_IDENTIFIER_MAGIC_SIZE) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += SESSION_IDENTIFIER_MAGIC_SIZE;
        if ((ret = ptls_decode64(issued_at, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = ptls_decode16(key_exchange_id, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *ticket_ctx = ptls_iovec_init(src, end - src);
            src = end;
        });
        ptls_decode_open_block(src, end, 1, {
            *negotiated_protocol = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}